

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Marray<float,std::allocator<unsigned_long>>::
Marray<andres::BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>,float>
          (Marray<float,std::allocator<unsigned_long>> *this,
          ViewExpression<andres::BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>,_float>
          *expression,allocator_type *allocator)

{
  float *pfVar1;
  size_t sVar2;
  size_t *begin;
  size_t *end;
  CoordinateOrder *pCVar3;
  CoordinateOrder *internalCoordinateOrder;
  ulong uVar4;
  ulong uVar5;
  value_type vVar6;
  allocator_type local_61;
  Geometry<std::allocator<unsigned_long>_> local_60;
  
  View<float,_false,_std::allocator<unsigned_long>_>::View
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this,(allocator_type *)&local_60)
  ;
  uVar5 = *(ulong *)(*(long *)(expression + 8) + 0x30);
  if (*(ulong *)(*(long *)(expression + 8) + 0x30) < *(ulong *)(*(long *)expression + 0x30)) {
    uVar5 = *(ulong *)(*(long *)expression + 0x30);
  }
  pfVar1 = __gnu_cxx::new_allocator<float>::allocate
                     ((new_allocator<float> *)(this + 0x40),uVar5,(void *)0x0);
  *(float **)this = pfVar1;
  sVar2 = BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
          ::dimension((BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                       *)expression);
  if (sVar2 == 0) {
    pCVar3 = BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
             ::coordinateOrder((BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                                *)expression);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::Geometry
              (&local_60,0,pCVar3,1,true,&local_61);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_60);
  }
  else {
    begin = BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
            ::shapeBegin((BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                          *)expression);
    end = BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
          ::shapeEnd((BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                      *)expression);
    pCVar3 = BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
             ::coordinateOrder((BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                                *)expression);
    internalCoordinateOrder =
         BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
         ::coordinateOrder((BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                            *)expression);
    marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long_const*>
              ((Geometry<std::allocator<unsigned_long>> *)&local_60,begin,end,pCVar3,
               internalCoordinateOrder,&local_61);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_60);
  }
  marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_60);
  sVar2 = BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
          ::dimension((BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                       *)expression);
  uVar5 = *(ulong *)(*(long *)expression + 0x30);
  uVar4 = *(ulong *)(*(long *)(expression + 8) + 0x30);
  if (sVar2 == 0) {
    if (uVar4 < uVar5) {
      uVar4 = uVar5;
    }
    marray_detail::Assert<bool>(uVar4 < 2);
    vVar6 = BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>
            ::operator()((BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>
                          *)expression,0);
    **(value_type **)this = vVar6;
  }
  else {
    marray_detail::Assert<bool>(uVar4 != 0 || uVar5 != 0);
    marray_detail::
    operate<andres::marray_detail::Assign<float,float>,float,std::allocator<unsigned_long>,andres::BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>,float>
              (this,expression);
  }
  Marray<float,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<float,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const ViewExpression<E, Te>& expression,
    const allocator_type& allocator
) 
:   dataAllocator_(allocator)
{
    this->data_ = dataAllocator_.allocate(expression.size());
    if(expression.dimension() == 0) {
        this->geometry_ = geometry_type(0, 
            static_cast<const E&>(expression).coordinateOrder(), 
            1, true, dataAllocator_);
    }
    else {
        this->geometry_ = geometry_type(
            static_cast<const E&>(expression).shapeBegin(), 
            static_cast<const E&>(expression).shapeEnd(),
            static_cast<const E&>(expression).coordinateOrder(),
            static_cast<const E&>(expression).coordinateOrder(),
            dataAllocator_);

    }
    const E& e = static_cast<const E&>(expression);
    if(e.dimension() == 0) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() < 2);
        this->data_[0] = static_cast<T>(e(0));
    }
    else {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() != 0);
        marray_detail::operate(*this, e, marray_detail::Assign<T, Te>());
    }
    testInvariant();
}